

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O0

void __thiscall Refal2::CArbitraryInteger::Div(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  bool _isNegative;
  bool bVar1;
  bool bVar2;
  int __denom;
  bool resultSign;
  bool operandSign;
  CArbitraryInteger *operand_local;
  CArbitraryInteger *this_local;
  
  removeLeadingZeros(this);
  removeLeadingZeros(operand);
  _isNegative = IsNegative(this);
  bVar1 = IsNegative(this);
  bVar2 = IsNegative(operand);
  div(this,(int)operand,__denom);
  SetSign(this,bVar1 != bVar2);
  SetSign(operand,_isNegative);
  removeLeadingZeros(this);
  return;
}

Assistant:

void CArbitraryInteger::Div( CArbitraryInteger& operand )
{
	removeLeadingZeros();
	operand.removeLeadingZeros();
	const bool operandSign = IsNegative();
	const bool resultSign = IsNegative() != operand.IsNegative();
	div( operand );
	SetSign( resultSign );
	operand.SetSign( operandSign );
	removeLeadingZeros();
}